

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::BuildEnum
          (DescriptorBuilder *this,EnumDescriptorProto *proto,Descriptor *parent,
          EnumDescriptor *result)

{
  int iVar1;
  Symbol symbol;
  Descriptor *pDVar2;
  string *full_name;
  string *psVar3;
  void *pvVar4;
  OptionsType *orig_options;
  long lVar5;
  long lVar6;
  string local_60;
  undefined4 local_40;
  undefined4 uStack_3c;
  EnumDescriptor *pEStack_38;
  
  pDVar2 = parent;
  if (parent == (Descriptor *)0x0) {
    pDVar2 = (Descriptor *)this->file_;
  }
  full_name = DescriptorPool::Tables::AllocateString(this->tables_,*(string **)(pDVar2 + 8));
  if (full_name->_M_string_length != 0) {
    std::__cxx11::string::_M_replace_aux((ulong)full_name,full_name->_M_string_length,0,'\x01');
  }
  std::__cxx11::string::_M_append((char *)full_name,(ulong)(proto->name_->_M_dataplus)._M_p);
  ValidateSymbolName(this,proto->name_,full_name,&proto->super_Message);
  psVar3 = DescriptorPool::Tables::AllocateString(this->tables_,proto->name_);
  *(string **)result = psVar3;
  *(string **)(result + 8) = full_name;
  *(FileDescriptor **)(result + 0x10) = this->file_;
  *(Descriptor **)(result + 0x18) = parent;
  *(undefined2 *)(result + 0x28) = 0;
  if ((proto->value_).super_RepeatedPtrFieldBase.current_size_ == 0) {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"Enums must contain at least one value.","");
    AddError(this,full_name,&proto->super_Message,NAME,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  iVar1 = (proto->value_).super_RepeatedPtrFieldBase.current_size_;
  *(int *)(result + 0x2c) = iVar1;
  pvVar4 = DescriptorPool::Tables::AllocateBytes(this->tables_,iVar1 * 0x28);
  *(void **)(result + 0x30) = pvVar4;
  if (0 < (proto->value_).super_RepeatedPtrFieldBase.current_size_) {
    lVar6 = 0;
    lVar5 = 0;
    do {
      BuildEnumValue(this,(EnumValueDescriptorProto *)
                          (proto->value_).super_RepeatedPtrFieldBase.elements_[lVar5],result,
                     (EnumValueDescriptor *)(*(long *)(result + 0x30) + lVar6));
      lVar5 = lVar5 + 1;
      lVar6 = lVar6 + 0x28;
    } while (lVar5 < (proto->value_).super_RepeatedPtrFieldBase.current_size_);
  }
  if ((proto->_has_bits_[0] & 4) == 0) {
    *(undefined8 *)(result + 0x20) = 0;
  }
  else {
    orig_options = proto->options_;
    if (orig_options == (OptionsType *)0x0) {
      orig_options = *(OptionsType **)(EnumDescriptorProto::default_instance_ + 0x30);
    }
    AllocateOptionsImpl<google::protobuf::EnumDescriptor>
              (this,*(string **)(result + 8),*(string **)(result + 8),orig_options,result);
  }
  local_40 = 3;
  symbol._4_4_ = uStack_3c;
  symbol.type = 3;
  symbol.field_1.enum_descriptor = result;
  pEStack_38 = result;
  AddSymbol(this,*(string **)(result + 8),parent,*(string **)result,&proto->super_Message,symbol);
  return;
}

Assistant:

void DescriptorBuilder::BuildEnum(const EnumDescriptorProto& proto,
                                  const Descriptor* parent,
                                  EnumDescriptor* result) {
  const string& scope = (parent == NULL) ?
    file_->package() : parent->full_name();
  string* full_name = tables_->AllocateString(scope);
  if (!full_name->empty()) full_name->append(1, '.');
  full_name->append(proto.name());

  ValidateSymbolName(proto.name(), *full_name, proto);

  result->name_            = tables_->AllocateString(proto.name());
  result->full_name_       = full_name;
  result->file_            = file_;
  result->containing_type_ = parent;
  result->is_placeholder_  = false;
  result->is_unqualified_placeholder_ = false;

  if (proto.value_size() == 0) {
    // We cannot allow enums with no values because this would mean there
    // would be no valid default value for fields of this type.
    AddError(result->full_name(), proto,
             DescriptorPool::ErrorCollector::NAME,
             "Enums must contain at least one value.");
  }

  BUILD_ARRAY(proto, result, value, BuildEnumValue, result);

  // Copy options.
  if (!proto.has_options()) {
    result->options_ = NULL;  // Will set to default_instance later.
  } else {
    AllocateOptions(proto.options(), result);
  }

  AddSymbol(result->full_name(), parent, result->name(),
            proto, Symbol(result));
}